

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O2

void __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::ClearStates(Scanner<UTF8EncodingPolicyBase<false>_> *this)

{
  this->m_fHadEol = 0;
  this->m_pchBase = (EncodedCharPtr)0x0;
  this->m_pchLast = (EncodedCharPtr)0x0;
  this->m_pchMinLine = (EncodedCharPtr)0x0;
  this->m_pchMinTok = (EncodedCharPtr)0x0;
  this->m_currentCharacter = (EncodedCharPtr)0x0;
  this->m_pchPrevLine = (EncodedCharPtr)0x0;
  this->m_fStringTemplateDepth = 0;
  this->m_cMinTokMultiUnits = 0;
  this->m_cMinLineMultiUnits = 0;
  this->field_0x508 = this->field_0x508 & 0x10;
  this->m_fYieldIsKeywordRegion = false;
  this->m_fAwaitIsKeywordRegion = false;
  this->m_pchStartLine = (EncodedCharPtr)0x0;
  this->m_startLine = 0;
  this->m_line = 0;
  this->m_scanState = ScanStateNormal;
  this->m_ichMinError = 0;
  this->m_ichLimError = 0;
  this->m_iecpLimTokPrevious = 0xffffffffffffffff;
  this->m_ichLimTokPrevious = 0xffffffff;
  return;
}

Assistant:

void Scanner<EncodingPolicy>::ClearStates()
{
    m_pchBase = nullptr;
    m_pchLast = nullptr;
    m_pchMinLine = nullptr;
    m_pchMinTok = nullptr;
    m_currentCharacter = nullptr;
    m_pchPrevLine = nullptr;

    m_cMinTokMultiUnits = 0;
    m_cMinLineMultiUnits = 0;

    m_fStringTemplateDepth = 0;

    m_fHadEol = FALSE;
    m_fIsModuleCode = FALSE;
    m_doubleQuoteOnLastTkStrCon = FALSE;
    m_OctOrLeadingZeroOnLastTKNumber = false;
    m_EscapeOnLastTkStrCon = false;
    m_fNextStringTemplateIsTagged = false;
    m_DeferredParseFlags = ScanFlagNone;

    m_fYieldIsKeywordRegion = false;
    m_fAwaitIsKeywordRegion = false;

    m_line = 0;
    m_scanState = ScanStateNormal;

    m_ichMinError = 0;
    m_ichLimError = 0;

    m_startLine = 0;
    m_pchStartLine = NULL;

    m_iecpLimTokPrevious = (size_t)-1;
    m_ichLimTokPrevious = (charcount_t)-1;
}